

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O0

int is_dual_or_quad_applicable(cdef_list *dlist,int width,int cdef_count,int bi,int iter)

{
  int iVar1;
  int blk_offset;
  int iter_local;
  int bi_local;
  int cdef_count_local;
  int width_local;
  cdef_list *dlist_local;
  int local_4;
  
  iVar1 = 3;
  if (width == 8) {
    iVar1 = 1;
  }
  if (iter + iVar1 < cdef_count) {
    if ((dlist[bi].by == dlist[bi + iVar1].by) &&
       ((uint)dlist[bi].bx + iVar1 == (uint)dlist[bi + iVar1].bx)) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int is_dual_or_quad_applicable(cdef_list *dlist, int width,
                                             int cdef_count, int bi, int iter) {
  assert(width == 8 || width == 4);
  const int blk_offset = (width == 8) ? 1 : 3;
  if ((iter + blk_offset) >= cdef_count) return 0;

  if (dlist[bi].by == dlist[bi + blk_offset].by &&
      dlist[bi].bx + blk_offset == dlist[bi + blk_offset].bx)
    return 1;

  return 0;
}